

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvector-generator.cpp
# Opt level: O0

void __thiscall
tokenized_prompt::padding_seq
          (tokenized_prompt *this,llama_context *ctx,vector<int,_std::allocator<int>_> *tokens,
          size_t len)

{
  reference pvVar1;
  size_type sVar2;
  ulong in_RCX;
  vector<int,_std::allocator<int>_> *in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  llama_token pad_tok;
  vector<int,_std::allocator<int>_> pad_tokens;
  value_type_conflict2 *__x;
  value_type vVar3;
  undefined4 in_stack_ffffffffffffff94;
  undefined1 in_stack_ffffffffffffff9e;
  undefined1 in_stack_ffffffffffffff9f;
  string *in_stack_ffffffffffffffa0;
  llama_context *in_stack_ffffffffffffffa8;
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  __x = (value_type_conflict2 *)&stack0xffffffffffffffa7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  common_tokenize(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                  (bool)in_stack_ffffffffffffff9f,(bool)in_stack_ffffffffffffff9e);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffa7);
  pvVar1 = std::vector<int,_std::allocator<int>_>::back(in_RSI);
  vVar3 = *pvVar1;
  while( true ) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RDX);
    if (in_RCX <= sVar2) break;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)CONCAT44(in_stack_ffffffffffffff94,vVar3),__x);
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)CONCAT44(in_stack_ffffffffffffff94,vVar3));
  return;
}

Assistant:

void padding_seq(llama_context * ctx, std::vector<llama_token> & tokens, size_t len) {
        // TODO: customize padding token
        std::vector<llama_token> pad_tokens = common_tokenize(ctx, " ", false);
        llama_token pad_tok = pad_tokens.back();
        while (tokens.size() < len) {
            tokens.push_back(pad_tok);
        }
    }